

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O1

uint32_t __thiscall
spirv_cross::Compiler::CombinedImageSamplerHandler::remap_parameter
          (CombinedImageSamplerHandler *this,uint32_t id)

{
  ulong uVar1;
  SPIRVariable *pSVar2;
  _Hash_node_base *p_Var3;
  _Elt_pointer puVar4;
  ulong uVar5;
  uint uVar6;
  __node_base_ptr p_Var7;
  __node_base_ptr p_Var8;
  
  uVar5 = (ulong)id;
  pSVar2 = maybe_get_backing_variable(this->compiler,id);
  if (pSVar2 != (SPIRVariable *)0x0) {
    uVar5 = (ulong)(pSVar2->super_IVariant).self.id;
  }
  uVar6 = (uint)uVar5;
  puVar4 = (this->parameter_remapping).c.
           super__Deque_base<std::unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>,_std::allocator<std::unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>_>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (puVar4 != (this->parameter_remapping).c.
                super__Deque_base<std::unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>,_std::allocator<std::unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>_>_>
                ._M_impl.super__Deque_impl_data._M_start._M_cur) {
    if (puVar4 == (this->parameter_remapping).c.
                  super__Deque_base<std::unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>,_std::allocator<std::unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_first) {
      puVar4 = (this->parameter_remapping).c.
               super__Deque_base<std::unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>,_std::allocator<std::unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 9;
    }
    uVar1 = puVar4[-1]._M_h._M_bucket_count;
    uVar5 = uVar5 % uVar1;
    p_Var7 = puVar4[-1]._M_h._M_buckets[uVar5];
    p_Var8 = (__node_base_ptr)0x0;
    if ((p_Var7 != (__node_base_ptr)0x0) &&
       (p_Var3 = p_Var7->_M_nxt, p_Var8 = p_Var7, uVar6 != *(uint *)&p_Var7->_M_nxt[1]._M_nxt)) {
      while (p_Var7 = p_Var3, p_Var3 = p_Var7->_M_nxt, p_Var3 != (_Hash_node_base *)0x0) {
        p_Var8 = (__node_base_ptr)0x0;
        if (((ulong)*(uint *)&p_Var3[1]._M_nxt % uVar1 != uVar5) ||
           (p_Var8 = p_Var7, uVar6 == *(uint *)&p_Var3[1]._M_nxt)) goto LAB_0033f221;
      }
      p_Var8 = (__node_base_ptr)0x0;
    }
LAB_0033f221:
    if (p_Var8 == (__node_base_ptr)0x0) {
      p_Var3 = (_Hash_node_base *)0x0;
    }
    else {
      p_Var3 = p_Var8->_M_nxt;
    }
    if (p_Var3 != (_Hash_node_base *)0x0) {
      uVar6 = *(uint *)((long)&p_Var3[1]._M_nxt + 4);
    }
  }
  return uVar6;
}

Assistant:

uint32_t Compiler::CombinedImageSamplerHandler::remap_parameter(uint32_t id)
{
	auto *var = compiler.maybe_get_backing_variable(id);
	if (var)
		id = var->self;

	if (parameter_remapping.empty())
		return id;

	auto &remapping = parameter_remapping.top();
	auto itr = remapping.find(id);
	if (itr != end(remapping))
		return itr->second;
	else
		return id;
}